

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O2

int TIFFVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  int iVar1;
  TIFFField *pTVar2;
  char *pcVar3;
  
  pTVar2 = TIFFFindField(tif,tag,TIFF_NOTYPE);
  if (pTVar2 == (TIFFField *)0x0) {
    pcVar3 = "";
    if (0xffff < tag) {
      pcVar3 = "pseudo-";
    }
    TIFFErrorExtR(tif,"TIFFSetField","%s: Unknown %stag %u",tif->tif_name,pcVar3,(ulong)tag);
  }
  else {
    if (((tag == 0x101) || ((tif->tif_flags & 0x40) == 0)) || (pTVar2->field_oktochange != '\0')) {
      iVar1 = (*(tif->tif_tagmethods).vsetfield)(tif,tag,ap);
      return iVar1;
    }
    TIFFErrorExtR(tif,"TIFFSetField","%s: Cannot modify tag \"%s\" while writing",tif->tif_name,
                  pTVar2->field_name);
  }
  return 0;
}

Assistant:

int TIFFVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    return OkToChangeTag(tif, tag)
               ? (*tif->tif_tagmethods.vsetfield)(tif, tag, ap)
               : 0;
}